

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QGraphicsSceneBspTree::Node> * __thiscall
QList<QGraphicsSceneBspTree::Node>::fill
          (QList<QGraphicsSceneBspTree::Node> *this,parameter_type t,qsizetype newSize)

{
  anon_union_8_2_82aba17e_for_Node_0 *paVar1;
  Data *pDVar2;
  Node *pNVar3;
  anon_union_8_2_82aba17e_for_Node_0 aVar4;
  Node NVar5;
  qsizetype qVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  anon_union_8_2_82aba17e_for_Node_0 local_48;
  Node *pNStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc < newSize)) {
    qVar6 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::detachCapacity(&this->d,newSize);
    _local_48 = (Node)QTypedArrayData<QGraphicsSceneBspTree::Node>::allocate(qVar6,KeepSize);
    local_38 = 0;
    QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::copyAppend
              ((QPodArrayOps<QGraphicsSceneBspTree::Node> *)&local_48,newSize,t);
    NVar5 = *(Node *)&this->d;
    (this->d).d = (Data *)local_48;
    (this->d).ptr = pNStack_40;
    qVar6 = (this->d).size;
    (this->d).size = local_38;
    _local_48 = NVar5;
    local_38 = qVar6;
    QArrayDataPointer<QGraphicsSceneBspTree::Node>::~QArrayDataPointer
              ((QArrayDataPointer<QGraphicsSceneBspTree::Node> *)&local_48);
  }
  else {
    _local_48 = *t;
    pNVar3 = (this->d).ptr;
    lVar7 = (this->d).size;
    if (newSize <= lVar7) {
      lVar7 = newSize;
    }
    for (lVar8 = 0; lVar7 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
      paVar1 = (anon_union_8_2_82aba17e_for_Node_0 *)((long)&pNVar3->field_0 + lVar8);
      aVar4 = *(anon_union_8_2_82aba17e_for_Node_0 *)&t->type;
      *paVar1 = t->field_0;
      paVar1[1] = aVar4;
    }
    lVar7 = (this->d).size;
    if (newSize - lVar7 == 0 || newSize < lVar7) {
      if (newSize < lVar7) {
        (this->d).size = newSize;
      }
    }
    else {
      QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::copyAppend
                ((QPodArrayOps<QGraphicsSceneBspTree::Node> *)this,newSize - lVar7,
                 (parameter_type)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}